

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

void __thiscall
wasm::ModuleReader::readBinaryData
          (ModuleReader *this,vector<char,_std::allocator<char>_> *input,Module *wasm,
          string *sourceMapFilename)

{
  void *__buf;
  undefined1 local_438 [8];
  WasmBinaryReader parser;
  vector<char,_std::allocator<char>_> sourceMapBuffer;
  
  parser.hasDataCount = false;
  parser._1001_7_ = 0;
  if (sourceMapFilename->_M_string_length != 0) {
    read_file<std::vector<char,std::allocator<char>>>
              ((vector<char,_std::allocator<char>_> *)local_438,(wasm *)sourceMapFilename,
               (string *)0x1,(BinaryOption)sourceMapFilename);
    std::vector<char,_std::allocator<char>_>::_M_move_assign
              ((vector<char,_std::allocator<char>_> *)&parser.hasDataCount,
               (_Vector_base<char,_std::allocator<char>_> *)local_438);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_438);
  }
  WasmBinaryReader::WasmBinaryReader
            ((WasmBinaryReader *)local_438,wasm,(FeatureSet)(wasm->features).features,input,
             (vector<char,_std::allocator<char>_> *)&parser.hasDataCount);
  parser.input._0_1_ = *this;
  parser.input._1_1_ = this[1];
  parser.input._2_1_ = this[8];
  WasmBinaryReader::read((WasmBinaryReader *)local_438,(int)wasm,__buf,(size_t)input);
  WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_438);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&parser.hasDataCount);
  return;
}

Assistant:

void ModuleReader::readBinaryData(std::vector<char>& input,
                                  Module& wasm,
                                  std::string sourceMapFilename) {
  std::vector<char> sourceMapBuffer;
  if (sourceMapFilename.size()) {
    sourceMapBuffer =
      read_file<std::vector<char>>(sourceMapFilename, Flags::Text);
  }
  // Assume that the wasm has had its initial features applied, and use those
  // while parsing.
  WasmBinaryReader parser(wasm, wasm.features, input, sourceMapBuffer);
  parser.setDebugInfo(debugInfo);
  parser.setDWARF(DWARF);
  parser.setSkipFunctionBodies(skipFunctionBodies);
  parser.read();
}